

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O2

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<char_const*,std::__cxx11::string>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,char **v,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = idx << 5;
  while( true ) {
    pbVar1 = (sv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(sv->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= idx) {
      return ss;
    }
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar1->_M_dataplus)._M_p + lVar3),"{}");
    if (bVar2) break;
    ::std::operator<<((ostream *)ss,
                      (string *)
                      ((long)&(((sv->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar3));
    idx = idx + 1;
    lVar3 = lVar3 + 0x20;
  }
  ::std::operator<<((ostream *)ss,*v);
  format_sv_rec<std::__cxx11::string>
            ((ostringstream *)ss,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)sv,idx + 1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
            );
  return ss;
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v, Rest const &...args) {
  if (idx >= sv.size()) {
    return ss;
  }

  if (sv[idx] == "{}") {
    ss << v;
    format_sv_rec(ss, sv, idx + 1, args...);
  } else {
    ss << sv[idx];
    format_sv_rec(ss, sv, idx + 1, v, args...);
  }

  return ss;
}